

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::TanH_x86_avx::forward_inplace(TanH_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  long lVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar14 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  auVar36 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pfVar6 = (float *)(sVar3 * uVar11 * sVar2 + (long)pvVar1);
    lVar9 = 0;
    for (iVar8 = 0; auVar35 = auVar36._0_16_, iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
      auVar4._4_4_ = pfVar6[1] * -2.0;
      auVar4._0_4_ = *pfVar6 * -2.0;
      auVar4._8_4_ = pfVar6[2] * -2.0;
      auVar4._12_4_ = pfVar6[3] * -2.0;
      auVar4._16_4_ = pfVar6[4] * -2.0;
      auVar4._20_4_ = pfVar6[5] * -2.0;
      auVar4._24_4_ = pfVar6[6] * -2.0;
      auVar4._28_4_ = 0xc0000000;
      auVar27._8_4_ = 0x42b0c0a5;
      auVar27._0_8_ = 0x42b0c0a542b0c0a5;
      auVar27._12_4_ = 0x42b0c0a5;
      auVar27._16_4_ = 0x42b0c0a5;
      auVar27._20_4_ = 0x42b0c0a5;
      auVar27._24_4_ = 0x42b0c0a5;
      auVar27._28_4_ = 0x42b0c0a5;
      auVar4 = vminps_avx(auVar4,auVar27);
      auVar28._8_4_ = 0xc2b0c0a5;
      auVar28._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar28._12_4_ = 0xc2b0c0a5;
      auVar28._16_4_ = 0xc2b0c0a5;
      auVar28._20_4_ = 0xc2b0c0a5;
      auVar28._24_4_ = 0xc2b0c0a5;
      auVar28._28_4_ = 0xc2b0c0a5;
      auVar27 = vmaxps_avx(auVar4,auVar28);
      auVar29._0_4_ = auVar27._0_4_ * 1.442695 + 0.5;
      auVar29._4_4_ = auVar27._4_4_ * 1.442695 + 0.5;
      auVar29._8_4_ = auVar27._8_4_ * 1.442695 + 0.5;
      auVar29._12_4_ = auVar27._12_4_ * 1.442695 + 0.5;
      auVar29._16_4_ = auVar27._16_4_ * 1.442695 + 0.5;
      auVar29._20_4_ = auVar27._20_4_ * 1.442695 + 0.5;
      auVar29._24_4_ = auVar27._24_4_ * 1.442695 + 0.5;
      auVar29._28_4_ = 0x3ff8aa3b;
      auVar14 = vroundps_avx(auVar29,1);
      auVar4 = vcmpps_avx(auVar29,auVar14,1);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar34._16_4_ = 0x3f800000;
      auVar34._20_4_ = 0x3f800000;
      auVar34._24_4_ = 0x3f800000;
      auVar34._28_4_ = 0x3f800000;
      auVar4 = vandps_avx(auVar4,auVar34);
      auVar4 = vsubps_avx(auVar14,auVar4);
      fVar12 = auVar27._0_4_ + auVar4._0_4_ * -0.6931472;
      fVar15 = auVar27._4_4_ + auVar4._4_4_ * -0.6931472;
      fVar16 = auVar27._8_4_ + auVar4._8_4_ * -0.6931472;
      fVar17 = auVar27._12_4_ + auVar4._12_4_ * -0.6931472;
      fVar18 = auVar27._16_4_ + auVar4._16_4_ * -0.6931472;
      fVar19 = auVar27._20_4_ + auVar4._20_4_ * -0.6931472;
      fVar20 = auVar27._24_4_ + auVar4._24_4_ * -0.6931472;
      auVar21._0_4_ = (int)auVar4._0_4_;
      auVar21._4_4_ = (int)auVar4._4_4_;
      auVar21._8_4_ = (int)auVar4._8_4_;
      auVar21._12_4_ = (int)auVar4._12_4_;
      auVar30._16_4_ = (int)auVar4._16_4_;
      auVar30._0_16_ = auVar21;
      auVar30._20_4_ = (int)auVar4._20_4_;
      auVar30._24_4_ = (int)auVar4._24_4_;
      auVar30._28_4_ = (int)auVar4._28_4_;
      auVar32 = vpslld_avx(auVar21,0x17);
      auVar21 = vpslld_avx(auVar30._16_16_,0x17);
      auVar21 = vpaddd_avx(auVar21,auVar35);
      auVar35 = vpaddd_avx(auVar32,auVar35);
      auVar14._0_4_ =
           (fVar12 + 1.0 +
           fVar12 * fVar12 *
           (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
             0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar35._0_4_ + 1.0;
      auVar14._4_4_ =
           (fVar15 + 1.0 +
           fVar15 * fVar15 *
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar35._4_4_ + 1.0;
      auVar14._8_4_ =
           (fVar16 + 1.0 +
           fVar16 * fVar16 *
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar35._8_4_ + 1.0;
      auVar14._12_4_ =
           (fVar17 + 1.0 +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar35._12_4_ + 1.0;
      auVar14._16_4_ =
           (fVar18 + 1.0 +
           fVar18 * fVar18 *
           (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
             0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar21._0_4_ + 1.0;
      auVar14._20_4_ =
           (fVar19 + 1.0 +
           fVar19 * fVar19 *
           (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
             0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar21._4_4_ + 1.0;
      auVar14._24_4_ =
           (fVar20 + 1.0 +
           fVar20 * fVar20 *
           (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
             0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar21._8_4_ + 1.0;
      auVar14._28_4_ = auVar27._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
      auVar31._8_4_ = 0x40000000;
      auVar31._0_8_ = 0x4000000040000000;
      auVar31._12_4_ = 0x40000000;
      auVar31._16_4_ = 0x40000000;
      auVar31._20_4_ = 0x40000000;
      auVar31._24_4_ = 0x40000000;
      auVar31._28_4_ = 0x40000000;
      auVar4 = vdivps_avx(auVar31,auVar14);
      *pfVar6 = auVar4._0_4_ + -1.0;
      pfVar6[1] = auVar4._4_4_ + -1.0;
      pfVar6[2] = auVar4._8_4_ + -1.0;
      pfVar6[3] = auVar4._12_4_ + -1.0;
      pfVar6[4] = auVar4._16_4_ + -1.0;
      pfVar6[5] = auVar4._20_4_ + -1.0;
      pfVar6[6] = auVar4._24_4_ + -1.0;
      pfVar6[7] = auVar4._28_4_ + -1.0;
      pfVar6 = pfVar6 + 8;
      lVar9 = lVar9 + 8;
    }
    for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar32._0_4_ = *pfVar6 * -2.0;
      auVar32._4_4_ = pfVar6[1] * -2.0;
      auVar32._8_4_ = pfVar6[2] * -2.0;
      auVar32._12_4_ = pfVar6[3] * -2.0;
      auVar22._8_4_ = 0x42b0c0a5;
      auVar22._0_8_ = 0x42b0c0a542b0c0a5;
      auVar22._12_4_ = 0x42b0c0a5;
      auVar21 = vminps_avx(auVar32,auVar22);
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar13 = vmaxps_avx(auVar21,auVar23);
      auVar24._0_4_ = auVar13._0_4_ * 1.442695 + 0.5;
      auVar24._4_4_ = auVar13._4_4_ * 1.442695 + 0.5;
      auVar24._8_4_ = auVar13._8_4_ * 1.442695 + 0.5;
      auVar24._12_4_ = auVar13._12_4_ * 1.442695 + 0.5;
      auVar33._0_4_ = (int)auVar24._0_4_;
      auVar33._4_4_ = (int)auVar24._4_4_;
      auVar33._8_4_ = (int)auVar24._8_4_;
      auVar33._12_4_ = (int)auVar24._12_4_;
      auVar32 = vcvtdq2ps_avx(auVar33);
      auVar21 = vcmpps_avx(auVar24,auVar32,1);
      auVar21 = vandps_avx(auVar21,auVar35);
      auVar21 = vsubps_avx(auVar32,auVar21);
      fVar12 = auVar13._0_4_ + auVar21._0_4_ * -0.6931472;
      fVar15 = auVar13._4_4_ + auVar21._4_4_ * -0.6931472;
      fVar16 = auVar13._8_4_ + auVar21._8_4_ * -0.6931472;
      fVar17 = auVar13._12_4_ + auVar21._12_4_ * -0.6931472;
      auVar25._0_4_ = (int)auVar21._0_4_;
      auVar25._4_4_ = (int)auVar21._4_4_;
      auVar25._8_4_ = (int)auVar21._8_4_;
      auVar25._12_4_ = (int)auVar21._12_4_;
      auVar21 = vpslld_avx(auVar25,0x17);
      auVar21 = vpaddd_avx(auVar21,auVar35);
      auVar13._0_4_ =
           (fVar12 + auVar36._0_4_ +
           fVar12 * fVar12 *
           (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
             0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5)) * auVar21._0_4_ + auVar36._0_4_;
      auVar13._4_4_ =
           (fVar15 + auVar36._4_4_ +
           fVar15 * fVar15 *
           (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
             0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar21._4_4_ + auVar36._4_4_;
      auVar13._8_4_ =
           (fVar16 + auVar36._8_4_ +
           fVar16 * fVar16 *
           (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
             0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar21._8_4_ + auVar36._8_4_;
      auVar13._12_4_ =
           (fVar17 + auVar36._12_4_ +
           fVar17 * fVar17 *
           (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
             0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar21._12_4_ + auVar36._12_4_;
      auVar26._8_4_ = 0x40000000;
      auVar26._0_8_ = 0x4000000040000000;
      auVar26._12_4_ = 0x40000000;
      auVar21 = vdivps_avx(auVar26,auVar13);
      *pfVar6 = auVar21._0_4_ + -1.0;
      pfVar6[1] = auVar21._4_4_ + -1.0;
      pfVar6[2] = auVar21._8_4_ + -1.0;
      pfVar6[3] = auVar21._12_4_ + -1.0;
      pfVar6 = pfVar6 + 4;
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar3 * sVar2 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      fVar12 = tanhf(*(float *)((long)pvVar1 + lVar9 * 4 + lVar5));
      auVar36 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar1 + lVar9 * 4 + lVar5) = fVar12;
    }
  }
  return 0;
}

Assistant:

int TanH_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}